

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

PaError ReadStream(PaStream *s,void *buffer,unsigned_long frames)

{
  snd_pcm_t *psVar1;
  snd_pcm_state_t sVar2;
  int iVar3;
  pthread_t __thread1;
  unsigned_long uVar4;
  unsigned_long *in_RDX;
  void *in_RSI;
  PaAlsaStream *in_RDI;
  int *unaff_retaddr;
  unsigned_long *in_stack_00000008;
  PaAlsaStream *in_stack_00000010;
  int xrun;
  int __pa_unsure_error_id;
  snd_pcm_t *save;
  void *userBuffer;
  unsigned_long framesAvail;
  unsigned_long framesGot;
  PaAlsaStream *stream;
  PaError result;
  long in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  PaHostApiTypeId hostApiType;
  unsigned_long *numFrames;
  unsigned_long in_stack_ffffffffffffffa8;
  undefined4 uVar5;
  int in_stack_ffffffffffffffb4;
  unsigned_long *in_stack_ffffffffffffffc8;
  unsigned_long *frameCount;
  undefined4 in_stack_ffffffffffffffe0;
  PaError PVar6;
  unsigned_long *local_18;
  
  hostApiType = (PaHostApiTypeId)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  PVar6 = 0;
  psVar1 = (in_RDI->playback).pcm;
  if ((in_RDI->capture).pcm == (snd_pcm_t *)0x0) {
    PaUtil_DebugPrint(
                     "Expression \'stream->capture.pcm\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4387\n"
                     );
    PVar6 = -0x26f7;
  }
  else {
    (in_RDI->playback).pcm = (snd_pcm_t *)0x0;
    if (0.0 < in_RDI->overrun) {
      PVar6 = -0x26fd;
      in_RDI->overrun = 0.0;
    }
    if ((in_RDI->capture).userInterleaved == 0) {
      memcpy((in_RDI->capture).userBuffers,in_RSI,(long)(in_RDI->capture).numUserChannels << 3);
    }
    sVar2 = (*alsa_snd_pcm_state)((in_RDI->capture).pcm);
    local_18 = in_RDX;
    if ((sVar2 == SND_PCM_STATE_PREPARED) &&
       (in_stack_ffffffffffffffb4 = (*(code *)alsa_snd_pcm_start)((in_RDI->capture).pcm),
       in_stack_ffffffffffffffb4 < 0)) {
      __thread1 = pthread_self();
      iVar3 = pthread_equal(__thread1,paUnixMainThread);
      if (iVar3 != 0) {
        (*alsa_snd_strerror)(in_stack_ffffffffffffffb4);
        PaUtil_SetLastHostErrorInfo(hostApiType,in_stack_ffffffffffffff98,(char *)0x115279);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_start( stream->capture.pcm )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4412\n"
                       );
      PVar6 = -9999;
    }
    else {
      while (local_18 != (unsigned_long *)0x0) {
        uVar5 = 0;
        paUtilErr_ = PaAlsaStream_WaitForFrames(in_stack_00000010,in_stack_00000008,unaff_retaddr);
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStream_WaitForFrames( stream, &framesAvail, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4418\n"
                           );
          PVar6 = paUtilErr_;
          break;
        }
        numFrames = local_18;
        if (in_stack_ffffffffffffffc8 < local_18) {
          numFrames = in_stack_ffffffffffffffc8;
        }
        frameCount = numFrames;
        paUtilErr_ = PaAlsaStream_SetUpBuffers(in_RDI,numFrames,(int *)in_stack_ffffffffffffffc8);
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaAlsaStream_SetUpBuffers( stream, &framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4421\n"
                           );
          PVar6 = paUtilErr_;
          break;
        }
        if (frameCount != (unsigned_long *)0x0) {
          uVar4 = PaUtil_CopyInput((PaUtilBufferProcessor *)
                                   CONCAT44(PVar6,in_stack_ffffffffffffffe0),(void **)in_RDI,
                                   (unsigned_long)frameCount);
          paUtilErr_ = PaAlsaStream_EndProcessing
                                 ((PaAlsaStream *)CONCAT44(in_stack_ffffffffffffffb4,uVar5),
                                  in_stack_ffffffffffffffa8,(int *)numFrames);
          if (paUtilErr_ < 0) {
            PaUtil_DebugPrint(
                             "Expression \'PaAlsaStream_EndProcessing( stream, framesGot, &xrun )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4425\n"
                             );
            PVar6 = paUtilErr_;
            break;
          }
          local_18 = (unsigned_long *)((long)local_18 - uVar4);
        }
      }
    }
  }
  (in_RDI->playback).pcm = psVar1;
  return PVar6;
}

Assistant:

static PaError ReadStream( PaStream* s,
                           void *buffer,
                           unsigned long frames )
{
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /* suppress unused variable warnings */
    (void) buffer;
    (void) frames;
    (void) stream;
    
    /* IMPLEMENT ME, see portaudio.h for required behavior*/

    return paNoError;
}